

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

void __thiscall cmELF::cmELF(cmELF *this,char *fname)

{
  string *this_00;
  _Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false> this_01;
  long *plVar1;
  cmELFInternalImpl<cmELFTypes64> *this_02;
  char *pcVar2;
  ByteOrderType order;
  char ident [16];
  _Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false> local_50;
  int local_48;
  char cStack_44;
  byte bStack_43;
  
  this->Internal = (cmELFInternal *)0x0;
  this_00 = &this->ErrorMessage;
  (this->ErrorMessage)._M_dataplus._M_p = (pointer)&(this->ErrorMessage).field_2;
  (this->ErrorMessage)._M_string_length = 0;
  (this->ErrorMessage).field_2._M_local_buf[0] = '\0';
  this_01._M_head_impl = (basic_ifstream<char,_std::char_traits<char>_> *)operator_new(0x208);
  std::ifstream::ifstream(this_01._M_head_impl,fname,_S_in);
  local_50._M_head_impl = this_01._M_head_impl;
  if (((byte)(this_01._M_head_impl + 0x20)[*(long *)(*(long *)this_01._M_head_impl + -0x18)] & 5) !=
      0) {
    std::__cxx11::string::_M_replace
              ((ulong)this_00,0,(char *)(this->ErrorMessage)._M_string_length,0x1c6ce8);
    goto LAB_0011b1a8;
  }
  plVar1 = (long *)std::istream::read((char *)this_01._M_head_impl,(long)&local_48);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    plVar1 = (long *)std::istream::seekg(this_01._M_head_impl,0,0);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
      pcVar2 = "Error seeking to beginning of file.";
      goto LAB_0011b190;
    }
    if (local_48 != 0x464c457f) {
      pcVar2 = "File does not have a valid ELF identification.";
      goto LAB_0011b190;
    }
    order = (ByteOrderType)bStack_43;
    if (bStack_43 == 1) {
LAB_0011b14f:
      if (cStack_44 == '\x02') {
        this_02 = (cmELFInternalImpl<cmELFTypes64> *)operator_new(200);
        cmELFInternalImpl<cmELFTypes64>::cmELFInternalImpl
                  (this_02,this,
                   (unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    *)&local_50,order);
      }
      else {
        if (cStack_44 != '\x01') {
          pcVar2 = "ELF file class is not 32-bit or 64-bit.";
          goto LAB_0011b1f4;
        }
        this_02 = (cmELFInternalImpl<cmELFTypes64> *)operator_new(0xc0);
        cmELFInternalImpl<cmELFTypes32>::cmELFInternalImpl
                  ((cmELFInternalImpl<cmELFTypes32> *)this_02,this,
                   (unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    *)&local_50,order);
      }
      this->Internal = &this_02->super_cmELFInternal;
    }
    else {
      if (bStack_43 == 2) {
        order = ByteOrderMSB;
        goto LAB_0011b14f;
      }
      pcVar2 = "ELF file is not LSB or MSB encoded.";
LAB_0011b1f4:
      std::__cxx11::string::operator=((string *)this_00,pcVar2);
    }
  }
  else {
    pcVar2 = "Error reading ELF identification.";
LAB_0011b190:
    std::__cxx11::string::_M_replace
              ((ulong)this_00,0,(char *)(this->ErrorMessage)._M_string_length,(ulong)pcVar2);
  }
  this_01._M_head_impl = local_50._M_head_impl;
  if (local_50._M_head_impl == (basic_ifstream<char,_std::char_traits<char>_> *)0x0) {
    return;
  }
LAB_0011b1a8:
  (**(code **)(*(long *)this_01._M_head_impl + 8))(this_01._M_head_impl);
  return;
}

Assistant:

cmELF::cmELF(const char* fname)
  : Internal(nullptr)
{
  // Try to open the file.
  std::unique_ptr<cmsys::ifstream> fin(new cmsys::ifstream(fname));

  // Quit now if the file could not be opened.
  if (!fin || !*fin) {
    this->ErrorMessage = "Error opening input file.";
    return;
  }

  // Read the ELF identification block.
  char ident[EI_NIDENT];
  if (!fin->read(ident, EI_NIDENT)) {
    this->ErrorMessage = "Error reading ELF identification.";
    return;
  }
  if (!fin->seekg(0)) {
    this->ErrorMessage = "Error seeking to beginning of file.";
    return;
  }

  // Verify the ELF identification.
  if (!(ident[EI_MAG0] == ELFMAG0 && ident[EI_MAG1] == ELFMAG1 &&
        ident[EI_MAG2] == ELFMAG2 && ident[EI_MAG3] == ELFMAG3)) {
    this->ErrorMessage = "File does not have a valid ELF identification.";
    return;
  }

  // Check the byte order in which the rest of the file is encoded.
  cmELFInternal::ByteOrderType order;
  if (ident[EI_DATA] == ELFDATA2LSB) {
    // File is LSB.
    order = cmELFInternal::ByteOrderLSB;
  } else if (ident[EI_DATA] == ELFDATA2MSB) {
    // File is MSB.
    order = cmELFInternal::ByteOrderMSB;
  } else {
    this->ErrorMessage = "ELF file is not LSB or MSB encoded.";
    return;
  }

  // Check the class of the file and construct the corresponding
  // parser implementation.
  if (ident[EI_CLASS] == ELFCLASS32) {
    // 32-bit ELF
    this->Internal = new cmELFInternalImpl<cmELFTypes32>(this, fin, order);
  }
#ifndef _SCO_DS
  else if (ident[EI_CLASS] == ELFCLASS64) {
    // 64-bit ELF
    this->Internal = new cmELFInternalImpl<cmELFTypes64>(this, fin, order);
  }
#endif
  else {
    this->ErrorMessage = "ELF file class is not 32-bit or 64-bit.";
    return;
  }